

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O0

void aom_hadamard_lp_16x16_c(int16_t *src_diff,ptrdiff_t src_stride,int16_t *coeff)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short *in_RDX;
  int16_t b3;
  int16_t b2;
  int16_t b1;
  int16_t b0;
  int16_t a3;
  int16_t a2;
  int16_t a1;
  int16_t a0;
  int idx_1;
  int16_t *src_ptr;
  int idx;
  int16_t *in_stack_000000d0;
  ptrdiff_t in_stack_000000d8;
  int16_t *in_stack_000000e0;
  int local_2c;
  int local_1c;
  short *local_18;
  
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    aom_hadamard_lp_8x8_c(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
  }
  local_18 = in_RDX;
  for (local_2c = 0; local_2c < 0x40; local_2c = local_2c + 1) {
    sVar1 = (short)((int)*local_18 + (int)local_18[0x40] >> 1);
    sVar2 = (short)((int)*local_18 - (int)local_18[0x40] >> 1);
    sVar3 = (short)((int)local_18[0x80] + (int)local_18[0xc0] >> 1);
    sVar4 = (short)((int)local_18[0x80] - (int)local_18[0xc0] >> 1);
    *local_18 = sVar1 + sVar3;
    local_18[0x40] = sVar2 + sVar4;
    local_18[0x80] = sVar1 - sVar3;
    local_18[0xc0] = sVar2 - sVar4;
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void aom_hadamard_lp_16x16_c(const int16_t *src_diff, ptrdiff_t src_stride,
                             int16_t *coeff) {
  for (int idx = 0; idx < 4; ++idx) {
    // src_diff: 9 bit, dynamic range [-255, 255]
    const int16_t *src_ptr =
        src_diff + (idx >> 1) * 8 * src_stride + (idx & 0x01) * 8;
    aom_hadamard_lp_8x8_c(src_ptr, src_stride, coeff + idx * 64);
  }

  for (int idx = 0; idx < 64; ++idx) {
    int16_t a0 = coeff[0];
    int16_t a1 = coeff[64];
    int16_t a2 = coeff[128];
    int16_t a3 = coeff[192];

    int16_t b0 = (a0 + a1) >> 1;  // (a0 + a1): 16 bit, [-32640, 32640]
    int16_t b1 = (a0 - a1) >> 1;  // b0-b3: 15 bit, dynamic range
    int16_t b2 = (a2 + a3) >> 1;  // [-16320, 16320]
    int16_t b3 = (a2 - a3) >> 1;

    coeff[0] = b0 + b2;  // 16 bit, [-32640, 32640]
    coeff[64] = b1 + b3;
    coeff[128] = b0 - b2;
    coeff[192] = b1 - b3;

    ++coeff;
  }
}